

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
::rebalance_left_to_right
          (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
           *this,field_type to_move,
          btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
          *right,allocator_type *alloc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  field_type fVar5;
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
  *pbVar6;
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
  *pbVar7;
  byte local_2a;
  byte local_29;
  field_type i_1;
  field_type i;
  allocator_type *alloc_local;
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
  *right_local;
  field_type to_move_local;
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
  *this_local;
  
  pbVar6 = parent(this);
  pbVar7 = parent(right);
  if (pbVar6 != pbVar7) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x760,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>>::rebalance_left_to_right(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>]"
                 );
  }
  bVar1 = position(this);
  bVar2 = position(right);
  if (bVar1 + 1 != (uint)bVar2) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x761,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>>::rebalance_left_to_right(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>]"
                 );
  }
  bVar1 = count(this);
  bVar2 = count(right);
  if (bVar1 < bVar2) {
    __assert_fail("count() >= right->count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x762,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>>::rebalance_left_to_right(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>]"
                 );
  }
  if (to_move == '\0') {
    __assert_fail("to_move >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x763,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>>::rebalance_left_to_right(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>]"
                 );
  }
  bVar1 = count(this);
  if (bVar1 < to_move) {
    __assert_fail("to_move <= count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x764,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>>::rebalance_left_to_right(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>]"
                 );
  }
  bVar1 = count(right);
  bVar2 = start(right);
  bVar3 = start(right);
  transfer_n_backward(right,(ulong)bVar1,(long)(int)((uint)bVar2 + (uint)to_move),(ulong)bVar3,right
                      ,alloc);
  bVar1 = start(right);
  bVar2 = position(this);
  pbVar6 = parent(this);
  transfer(right,(long)(int)((uint)bVar1 + (uint)to_move + -1),(ulong)bVar2,pbVar6,alloc);
  bVar1 = start(right);
  bVar2 = finish(this);
  transfer_n(right,(long)(int)(to_move - 1),(ulong)bVar1,(long)(int)((uint)bVar2 - (to_move - 1)),
             this,alloc);
  pbVar6 = parent(this);
  bVar1 = position(this);
  bVar2 = finish(this);
  transfer(pbVar6,(ulong)bVar1,(long)(int)((uint)bVar2 - (uint)to_move),this,alloc);
  bVar4 = is_internal(this);
  if (bVar4) {
    fVar5 = finish(right);
    for (local_29 = fVar5 + 1; bVar1 = start(right), bVar1 < local_29; local_29 = local_29 - 1) {
      pbVar6 = child(right,local_29 - 1);
      init_child(right,(local_29 - 1) + to_move,pbVar6);
      clear_child(right,local_29 - 1);
    }
    for (local_2a = 1; local_2a <= to_move; local_2a = local_2a + 1) {
      fVar5 = finish(this);
      pbVar6 = child(this,(fVar5 - to_move) + local_2a);
      init_child(right,local_2a - 1,pbVar6);
      fVar5 = finish(this);
      clear_child(this,(fVar5 - to_move) + local_2a);
    }
  }
  fVar5 = finish(this);
  set_finish(this,fVar5 - to_move);
  fVar5 = finish(right);
  set_finish(right,fVar5 + to_move);
  return;
}

Assistant:

void btree_node<P>::rebalance_left_to_right(field_type to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(count() >= right->count());
  assert(to_move >= 1);
  assert(to_move <= count());

  // Values in the right node are shifted to the right to make room for the
  // new to_move values. Then, the delimiting value in the parent and the
  // other (to_move - 1) values in the left node are moved into the right node.
  // Lastly, a new delimiting value is moved from the left node into the
  // parent, and the remaining empty left node entries are destroyed.

  // 1) Shift existing values in the right node to their correct positions.
  right->transfer_n_backward(right->count(), right->start() + to_move,
                             right->start(), right, alloc);

  // 2) Move the delimiting value in the parent to the right node.
  right->transfer(right->start() + to_move - 1, position(), parent(), alloc);

  // 3) Move the (to_move - 1) values from the left node to the right node.
  right->transfer_n(to_move - 1, right->start(), finish() - (to_move - 1), this,
                    alloc);

  // 4) Move the new delimiting value to the parent from the left node.
  parent()->transfer(position(), finish() - to_move, this, alloc);

  if (is_internal()) {
    // Move the child pointers from the left to the right node.
    for (field_type i = right->finish() + 1; i > right->start(); --i) {
      right->init_child(i - 1 + to_move, right->child(i - 1));
      right->clear_child(i - 1);
    }
    for (field_type i = 1; i <= to_move; ++i) {
      right->init_child(i - 1, child(finish() - to_move + i));
      clear_child(finish() - to_move + i);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_finish(finish() - to_move);
  right->set_finish(right->finish() + to_move);
}